

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O1

string * __thiscall
re2c::InputAPI::stmt_backup_peek_abi_cxx11_
          (string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  size_type *psVar1;
  type_t tVar2;
  undefined8 *puVar3;
  opt_t *poVar4;
  long *plVar5;
  long *plVar6;
  ulong *puVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  string local_150;
  string local_130;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  string local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  undefined8 local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  tVar2 = this->type_;
  if (tVar2 != DEFAULT) {
    stmt_backup_abi_cxx11_(&local_130,this,ind);
    stmt_peek_abi_cxx11_(&local_150,this,ind);
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      uVar10 = local_130.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_150._M_string_length + local_130._M_string_length) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        uVar10 = local_150.field_2._M_allocated_capacity;
      }
      if (local_150._M_string_length + local_130._M_string_length <= (ulong)uVar10) {
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_150,0,(char *)0x0,(ulong)local_130._M_dataplus._M_p);
        goto LAB_00122af0;
      }
    }
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_150._M_dataplus._M_p);
    goto LAB_00122af0;
  }
  local_b0 = &local_a0;
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  iVar8 = ind + 1;
  while ((poVar4 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar4->target != DOT &&
         (iVar8 = iVar8 + -1, iVar8 != 0))) {
    poVar4 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    std::__cxx11::string::_M_append((char *)&local_b0,(ulong)(poVar4->indString)._M_dataplus._M_p);
  }
  poVar4 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)(poVar4->yych)._M_dataplus._M_p);
  local_70 = &local_60;
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar5[3];
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_e0 = *puVar7;
    lStack_d8 = plVar5[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar7;
    local_f0 = (ulong *)*plVar5;
  }
  local_e8 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  Opt::yychConversion_abi_cxx11_(&local_d0,(Opt *)&opts);
  uVar9 = 0xf;
  if (local_f0 != &local_e0) {
    uVar9 = local_e0;
  }
  if (uVar9 < local_d0._M_string_length + local_e8) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar10 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_d0._M_string_length + local_e8) goto LAB_001228d2;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_001228d2:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_d0._M_dataplus._M_p);
  }
  local_110 = &local_100;
  plVar5 = puVar3 + 2;
  if ((long *)*puVar3 == plVar5) {
    local_100 = *plVar5;
    uStack_f8 = puVar3[3];
  }
  else {
    local_100 = *plVar5;
    local_110 = (long *)*puVar3;
  }
  local_108 = puVar3[1];
  *puVar3 = plVar5;
  puVar3[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_90 = &local_80;
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar5[3];
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  poVar4 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(poVar4->yymarker)._M_dataplus._M_p);
  local_50 = &local_40;
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_40 = *plVar6;
    lStack_38 = plVar5[3];
  }
  else {
    local_40 = *plVar6;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  puVar7 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_150.field_2._M_allocated_capacity = *puVar7;
    local_150.field_2._8_8_ = plVar5[3];
  }
  else {
    local_150.field_2._M_allocated_capacity = *puVar7;
    local_150._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_150._M_string_length = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  poVar4 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_150,(ulong)(poVar4->yycursor)._M_dataplus._M_p);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  puVar7 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_130.field_2._M_allocated_capacity = *puVar7;
    local_130.field_2._8_8_ = plVar5[3];
  }
  else {
    local_130.field_2._M_allocated_capacity = *puVar7;
    local_130._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_130._M_string_length = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
LAB_00122af0:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar10 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar10;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (tVar2 == DEFAULT) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_b0 == &local_a0) {
      return __return_storage_ptr__;
    }
    uVar10 = CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]);
    _Var11._M_p = (pointer)local_b0;
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    uVar10 = local_130.field_2._M_allocated_capacity;
    _Var11._M_p = local_130._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == &local_130.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(_Var11._M_p,uVar10 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_backup_peek (uint32_t ind) const
{
	return type_ == DEFAULT
		? indent (ind) + opts->yych + " = " + opts.yychConversion () + "*(" + opts->yymarker + " = " + opts->yycursor + ");\n"
		: stmt_backup (ind) + stmt_peek (ind);
}